

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O1

void find_cost_range(cs_active *cs_a,single_learner *base,example *ec,uint32_t i,float delta,
                    float eta,float *min_pred,float *max_pred,bool *is_range_large)

{
  uint64_t *puVar1;
  ostream *poVar2;
  uint64_t uVar3;
  char *pcVar4;
  int iVar5;
  float sens;
  float fVar6;
  float fVar7;
  float fVar8;
  anon_union_4_2_947300a4 x;
  
  iVar5 = i - 1;
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar5);
  (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20));
  uVar3 = (ec->super_example_predict).ft_offset - (ulong)(uint)(*(int *)(base + 0xe0) * iVar5);
  (ec->super_example_predict).ft_offset = uVar3;
  (ec->super_example_predict).ft_offset = (uint)(*(int *)(base + 0xe0) * iVar5) + uVar3;
  sens = (float)(**(code **)(base + 0x50))
                          (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),ec);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - (ulong)(uint)(iVar5 * *(int *)(base + 0xe0));
  if ((cs_a->t < 2) || ((~(uint)sens & 0x7f800000) == 0)) {
    *min_pred = cs_a->cost_min;
    *max_pred = cs_a->cost_max;
    *is_range_large = true;
    if (cs_a->print_debug_stuff == false) {
      return;
    }
    pcVar4 = "  find_cost_rangeA: i=";
  }
  else {
    fVar7 = (ec->pred).scalar;
    fVar8 = cs_a->cost_max;
    fVar6 = binarySearch(fVar8 - fVar7,delta,sens,1e-06);
    fVar7 = fVar6 * sens + fVar7;
    if (fVar7 <= fVar8) {
      fVar8 = fVar7;
    }
    *max_pred = fVar8;
    fVar7 = (ec->pred).scalar;
    fVar8 = cs_a->cost_min;
    fVar6 = binarySearch(fVar7 - fVar8,delta,sens,1e-06);
    fVar7 = fVar7 - fVar6 * sens;
    if (fVar8 <= fVar7) {
      fVar8 = fVar7;
    }
    *min_pred = fVar8;
    *is_range_large = eta < *max_pred - fVar8;
    if (cs_a->print_debug_stuff != true) {
      return;
    }
    pcVar4 = "  find_cost_rangeB: i=";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,0x16);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," pp=",4);
  poVar2 = std::ostream::_M_insert<double>((double)ec->partial_prediction);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," sens=",6);
  poVar2 = std::ostream::_M_insert<double>((double)sens);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," eta=",5);
  poVar2 = std::ostream::_M_insert<double>((double)eta);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," [",2);
  poVar2 = std::ostream::_M_insert<double>((double)*min_pred);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>((double)*max_pred);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] = ",4);
  poVar2 = std::ostream::_M_insert<double>((double)(*max_pred - *min_pred));
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

inline void find_cost_range(cs_active& cs_a, single_learner& base, example& ec, uint32_t i, float delta, float eta,
    float& min_pred, float& max_pred, bool& is_range_large)
{
  float tol = 1e-6f;

  base.predict(ec, i - 1);
  float sens = base.sensitivity(ec, i - 1);

  if (cs_a.t <= 1 || nanpattern(sens) || infpattern(sens))
  {
    min_pred = cs_a.cost_min;
    max_pred = cs_a.cost_max;
    is_range_large = true;
    if (cs_a.print_debug_stuff)
      cerr << "  find_cost_rangeA: i=" << i << " pp=" << ec.partial_prediction << " sens=" << sens << " eta=" << eta
           << " [" << min_pred << ", " << max_pred << "] = " << (max_pred - min_pred) << endl;
  }
  else
  {
    // finding max_pred and min_pred by binary search
    max_pred =
        min(ec.pred.scalar + sens * binarySearch(cs_a.cost_max - ec.pred.scalar, delta, sens, tol), cs_a.cost_max);
    min_pred =
        max(ec.pred.scalar - sens * binarySearch(ec.pred.scalar - cs_a.cost_min, delta, sens, tol), cs_a.cost_min);
    is_range_large = (max_pred - min_pred > eta);
    if (cs_a.print_debug_stuff)
      cerr << "  find_cost_rangeB: i=" << i << " pp=" << ec.partial_prediction << " sens=" << sens << " eta=" << eta
           << " [" << min_pred << ", " << max_pred << "] = " << (max_pred - min_pred) << endl;
  }
}